

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O3

void __thiscall cmFLTKWrapUICommand::FinalPass(cmFLTKWrapUICommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  cmTarget *this_00;
  string *psVar4;
  string *psVar5;
  mapped_type *this_01;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  _Alloc_hider _Var9;
  long lVar10;
  string msg;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcs;
  string local_68;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_48;
  
  this_00 = cmMakefile::FindTarget((this->super_cmCommand).Makefile,&this->Target,false);
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (this_00 == (cmTarget *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"FLTK_WRAP_UI was called with a target that was never created: ",
               "");
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)(this->Target)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_68);
    cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::append((char *)&local_68);
    std::__cxx11::string::append((char *)&local_68);
    cmSystemTools::Message(local_68._M_dataplus._M_p,"Warning");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == paVar1) {
      return;
    }
    uVar8 = local_68.field_2._M_allocated_capacity + 1;
    _Var9._M_p = local_68._M_dataplus._M_p;
  }
  else {
    local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    cmTarget::GetSourceFiles(this_00,&local_48,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar8 = 0;
      uVar6 = 1;
      do {
        psVar4 = cmSourceFile::GetFullPath
                           (local_48.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar8],(string *)0x0);
        psVar5 = cmSourceFile::GetFullPath
                           (*(this->GeneratedSourcesClasses).
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                             _M_impl.super__Vector_impl_data._M_start,(string *)0x0);
        __n = psVar4->_M_string_length;
        if ((__n == psVar5->_M_string_length) &&
           ((__n == 0 ||
            (iVar3 = bcmp((psVar4->_M_dataplus)._M_p,(psVar5->_M_dataplus)._M_p,__n), iVar3 == 0))))
        goto LAB_003451c0;
        bVar2 = uVar6 < (ulong)((long)local_48.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_48.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar8 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar2);
    }
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "In CMake 2.2 the FLTK_WRAP_UI command sets a variable to the list of source files that should be added to your executable or library. It appears that you have not added these source files to your target. You should change your CMakeLists.txt file to directly add the generated files to the target. For example FTLK_WRAP_UI(foo src1 src2 src3) will create a variable named foo_FLTK_UI_SRCS that contains the list of sources to add to your target when you call ADD_LIBRARY or ADD_EXECUTABLE. For now CMake will add the sources to your target for you as was done in CMake 2.0 and earlier. In the future this may become an error."
               ,"");
    std::__cxx11::string::append((char *)&local_68);
    cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::append((char *)&local_68);
    cmSystemTools::Message(local_68._M_dataplus._M_p,"Warning");
    lVar10 = (long)(this->GeneratedSourcesClasses).
                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->GeneratedSourcesClasses).
                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar10 != 0) {
      lVar10 = lVar10 >> 3;
      lVar7 = 0;
      do {
        this_01 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&((this->super_cmCommand).Makefile)->Targets,&this->Target);
        psVar4 = cmSourceFile::GetFullPath
                           ((this->GeneratedSourcesClasses).
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar7],(string *)0x0);
        cmTarget::AddSource(this_01,psVar4);
        lVar7 = lVar7 + 1;
      } while (lVar10 + (ulong)(lVar10 == 0) != lVar7);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
LAB_003451c0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
           super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return;
    }
    uVar8 = (long)local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage -
            (long)local_48.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    _Var9._M_p = (pointer)local_48.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
  }
  operator_delete(_Var9._M_p,uVar8);
  return;
}

Assistant:

void cmFLTKWrapUICommand::FinalPass()
{
  // people should add the srcs to the target themselves, but the old command
  // didn't support that, so check and see if they added the files in and if
  // they didn;t then print a warning and add then anyhow
  cmTarget* target = this->Makefile->FindTarget(this->Target);
  if(!target)
    {
    std::string msg =
      "FLTK_WRAP_UI was called with a target that was never created: ";
    msg += this->Target;
    msg +=".  The problem was found while processing the source directory: ";
    msg += this->Makefile->GetCurrentSourceDirectory();
    msg += ".  This FLTK_WRAP_UI call will be ignored.";
    cmSystemTools::Message(msg.c_str(),"Warning");
    return;
    }
  std::vector<cmSourceFile*> srcs;
  target->GetSourceFiles(srcs, "");
  bool found = false;
  for (unsigned int i = 0; i < srcs.size(); ++i)
    {
    if (srcs[i]->GetFullPath() ==
        this->GeneratedSourcesClasses[0]->GetFullPath())
      {
      found = true;
      break;
      }
    }
  if (!found)
    {
    std::string msg =
      "In CMake 2.2 the FLTK_WRAP_UI command sets a variable to the list of "
      "source files that should be added to your executable or library. It "
      "appears that you have not added these source files to your target. "
      "You should change your CMakeLists.txt file to "
      "directly add the generated files to the target. "
      "For example FTLK_WRAP_UI(foo src1 src2 src3) "
      "will create a variable named foo_FLTK_UI_SRCS that contains the list "
      "of sources to add to your target when you call ADD_LIBRARY or "
      "ADD_EXECUTABLE. For now CMake will add the sources to your target "
      "for you as was done in CMake 2.0 and earlier. In the future this may "
      "become an error.";
    msg +="The problem was found while processing the source directory: ";
    msg += this->Makefile->GetCurrentSourceDirectory();
    cmSystemTools::Message(msg.c_str(),"Warning");
    // first we add the rules for all the .fl to .h and .cxx files
    size_t lastHeadersClass = this->GeneratedSourcesClasses.size();

    // Generate code for all the .fl files
    for(size_t classNum = 0; classNum < lastHeadersClass; classNum++)
      {
      this->Makefile->GetTargets()[this->Target]
        .AddSource(this->GeneratedSourcesClasses[classNum]->GetFullPath());
      }
    }
}